

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int collect_remote_banner(LIBSSH2_SESSION *session,size_t banner_len)

{
  uchar *puVar1;
  int iVar2;
  size_t __n;
  uchar *puVar3;
  char *errmsg;
  ulong uVar4;
  
  puVar3 = (session->remote).banner;
  if (puVar3 == (uchar *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen((char *)puVar3);
  }
  uVar4 = __n + banner_len + 1;
  if (uVar4 < 0x2001) {
    puVar3 = (uchar *)(*session->alloc)(uVar4,&session->abstract);
    if (puVar3 != (uchar *)0x0) {
      if (__n != 0) {
        memcpy(puVar3,(session->remote).banner,__n);
      }
      memcpy(puVar3 + __n,session->banner_TxRx_banner,banner_len);
      puVar3[__n + banner_len] = '\0';
      puVar1 = (session->remote).banner;
      if (puVar1 != (uchar *)0x0) {
        (*session->free)(puVar1,&session->abstract);
      }
      (session->remote).banner = puVar3;
      return 0;
    }
    errmsg = "Error allocating space for remote banner";
    iVar2 = -6;
  }
  else {
    errmsg = "Remote banner line too long";
    iVar2 = -2;
  }
  iVar2 = _libssh2_error(session,iVar2,errmsg);
  return iVar2;
}

Assistant:

static int collect_remote_banner(LIBSSH2_SESSION * session,
                                 size_t banner_len) {
    /* determine size for existing and more banner and allocate */                                
    unsigned char* new_banner;
    size_t total_len, existing_len = 0;
    if(session->remote.banner) existing_len = strlen((char const*)session->remote.banner);
    total_len = existing_len + banner_len + 1;

    if(total_len > LIBSSH2_SERVER_BANNER_MAX_LINE_LEN) {
        return _libssh2_error(session, LIBSSH2_ERROR_BANNER_RECV,
                              "Remote banner line too long");
    }

    new_banner = LIBSSH2_ALLOC(session, total_len);
    if(!new_banner) {
      return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                            "Error allocating space for remote banner");
    }

    /* combine existing and more banner into a single memory chunk */
    if(existing_len > 0) memcpy(new_banner, session->remote.banner, existing_len);
    memcpy(new_banner + existing_len, session->banner_TxRx_banner, banner_len);
    new_banner[existing_len + banner_len] = '\0';

    if(session->remote.banner)
        LIBSSH2_FREE(session, session->remote.banner);
    session->remote.banner = new_banner;

    return LIBSSH2_ERROR_NONE;
}